

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::
BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
          (DrawIndirectBase *this,GLuint expectedValue)

{
  bool bVar1;
  DILogger *pDVar2;
  long lVar3;
  DILogger local_810;
  GLdouble local_690;
  GLdouble valueDouble;
  float local_508;
  GLfloat local_504;
  GLfloat expectedFloatValue;
  GLfloat valueFloat;
  string local_4e0;
  DILogger local_4c0;
  GLboolean local_339;
  undefined1 local_338 [7];
  GLboolean valueBool;
  GLuint local_1a4;
  undefined1 local_1a0 [4];
  GLint valueInt;
  DIResult status;
  GLuint expectedValue_local;
  DrawIndirectBase *this_local;
  
  status.status_._4_4_ = expectedValue;
  DIResult::DIResult((DIResult *)local_1a0);
  local_1a4 = 0xffffd8f1;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f43,
             (GLint *)&local_1a4);
  if (local_1a4 != status.status_._4_4_) {
    DIResult::error((DILogger *)local_338,(DIResult *)local_1a0);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)local_338,
                        (char (*) [72])
                        "glGetIntegerv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)pDVar2,(int *)&local_1a4);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)pDVar2,(char (*) [13])0x2a22899);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)pDVar2,(uint *)((long)&status.status_ + 4));
    DILogger::~DILogger((DILogger *)local_338);
  }
  local_339 = status.status_._4_4_ == 0;
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f43,&local_339);
  if ((bool)local_339 != (status.status_._4_4_ != 0)) {
    DIResult::error(&local_4c0,(DIResult *)local_1a0);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)&local_4c0,
                        (char (*) [72])
                        "glGetBooleanv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_4e0,(DrawIndirectBase *)this,local_339);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)pDVar2,&local_4e0);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)pDVar2,(char (*) [13])0x2a22899);
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              ((string *)&expectedFloatValue,(DrawIndirectBase *)this,status.status_._4_4_ != 0);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)pDVar2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &expectedFloatValue);
    std::__cxx11::string::~string((string *)&expectedFloatValue);
    std::__cxx11::string::~string((string *)&local_4e0);
    DILogger::~DILogger(&local_4c0);
  }
  local_504 = -9999.0;
  local_508 = (float)status.status_._4_4_;
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f43,&local_504);
  if ((local_504 != local_508) || (NAN(local_504) || NAN(local_508))) {
    DIResult::error((DILogger *)&valueDouble,(DIResult *)local_1a0);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)&valueDouble,
                        (char (*) [70])
                        "glGetFloatv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)pDVar2,&local_504);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)pDVar2,(char (*) [13])0x2a22899);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)pDVar2,(uint *)((long)&status.status_ + 4));
    DILogger::~DILogger((DILogger *)&valueDouble);
  }
  bVar1 = test_api::ES3::isES();
  if (!bVar1) {
    local_690 = -9999.0;
    glu::CallLogWrapper::glGetDoublev
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f43,&local_690);
    if ((local_690 != (double)status.status_._4_4_) ||
       (NAN(local_690) || NAN((double)status.status_._4_4_))) {
      DIResult::error(&local_810,(DIResult *)local_1a0);
      pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                         ((DILogger *)&local_810,
                          (char (*) [71])
                          "glGetDoublev(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
      pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)pDVar2,&local_690);
      pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                         ((DILogger *)pDVar2,(char (*) [13])0x2a22899);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)pDVar2,(uint *)((long)&status.status_ + 4));
      DILogger::~DILogger(&local_810);
    }
  }
  lVar3 = DIResult::code((DIResult *)local_1a0);
  DIResult::~DIResult((DIResult *)local_1a0);
  return lVar3;
}

Assistant:

long BindingPointCheck(GLuint expectedValue)
	{
		DIResult status;

		GLint valueInt = -9999;
		glGetIntegerv(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueInt);
		if (valueInt != static_cast<GLint>(expectedValue))
		{
			status.error() << "glGetIntegerv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: " << valueInt
						   << ", expected: " << expectedValue;
		}

		GLboolean valueBool = expectedValue ? GL_FALSE : GL_TRUE;
		glGetBooleanv(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueBool);
		if (valueBool != (expectedValue ? GL_TRUE : GL_FALSE))
		{
			status.error() << "glGetBooleanv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: "
						   << BoolToString(valueBool)
						   << ", expected: " << BoolToString(expectedValue ? GL_TRUE : GL_FALSE);
		}

		GLfloat valueFloat		   = -9999;
		GLfloat expectedFloatValue = static_cast<GLfloat>(expectedValue);
		glGetFloatv(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueFloat);
		if (valueFloat != expectedFloatValue)
		{
			status.error() << "glGetFloatv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: " << valueFloat
						   << ", expected: " << expectedValue;
		}

		if (!api::isES())
		{
			GLdouble valueDouble = -9999;
			glGetDoublev(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueDouble);
			if (valueDouble != static_cast<GLdouble>(expectedValue))
			{
				status.error() << "glGetDoublev(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: "
							   << valueDouble << ", expected: " << expectedValue;
			}
		}

		return status.code();
	}